

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::ClearField(Reflection *this,Message *message,FieldDescriptor *field)

{
  float fVar1;
  pointer pcVar2;
  size_type sVar3;
  Descriptor *expected;
  bool bVar4;
  uint32_t uVar5;
  CppStringType CVar6;
  RepeatedField<int> *this_00;
  OneofDescriptor *pOVar7;
  RepeatedField<unsigned_long> *this_01;
  MapFieldBase *this_02;
  RepeatedField<long> *this_03;
  RepeatedField<unsigned_int> *this_04;
  RepeatedField<bool> *this_05;
  RepeatedField<double> *this_06;
  RepeatedField<float> *this_07;
  RepeatedField<absl::lts_20250127::Cord> *this_08;
  RepeatedPtrFieldBase *pRVar8;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *paVar9;
  Message **ppMVar10;
  EnumValueDescriptor *pEVar11;
  uint *puVar12;
  float *pfVar13;
  bool *pbVar14;
  Cord *pCVar15;
  InlinedStringField *pIVar16;
  ArenaStringPtr *this_09;
  uint uVar17;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 aVar18;
  Metadata MVar19;
  string_view src;
  
  MVar19 = Message::GetMetadata(message);
  if (MVar19.reflection != this) {
    expected = this->descriptor_;
    MVar19 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(expected,MVar19.descriptor,field,"ClearField")
    ;
  }
  if (field->containing_type_ != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  if ((field->field_0x1 & 8) != 0) {
    uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    internal::ExtensionSet::ClearExtension
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),field->number_
              );
    return;
  }
  bVar4 = FieldDescriptor::is_repeated(field);
  if (bVar4) {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
    case 1:
    case 8:
      this_00 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      RepeatedField<int>::Clear(this_00);
      return;
    case 2:
      this_03 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      RepeatedField<long>::Clear(this_03);
      return;
    case 3:
      this_04 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      RepeatedField<unsigned_int>::Clear(this_04);
      return;
    case 4:
      this_01 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      RepeatedField<unsigned_long>::Clear(this_01);
      return;
    case 5:
      this_06 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message,field);
      RepeatedField<double>::Clear(this_06);
      return;
    case 6:
      this_07 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      RepeatedField<float>::Clear(this_07);
      return;
    case 7:
      this_05 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      RepeatedField<bool>::Clear(this_05);
      return;
    case 9:
      goto switchD_00212cbd_caseD_9;
    case 10:
      bVar4 = FieldDescriptor::is_map(field);
      if (bVar4) {
        this_02 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
        internal::MapFieldBase::Clear(this_02);
        return;
      }
      pRVar8 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
      internal::RepeatedPtrFieldBase::
      Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(pRVar8);
      return;
    default:
      return;
    }
  }
  pOVar7 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar7 != (OneofDescriptor *)0x0) {
    ClearOneofField(this,message,field);
    return;
  }
  bVar4 = HasFieldSingular(this,message,field);
  if (!bVar4) {
    return;
  }
  ClearHasBit(this,message,field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    uVar17 = (field->field_20).default_value_int32_t_;
    goto LAB_00212f92;
  case 2:
    aVar18 = field->field_20;
    paVar9 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)MutableRaw<long>(this,message,field)
    ;
    goto LAB_00212fb6;
  case 3:
    uVar17 = (field->field_20).default_value_int32_t_;
    puVar12 = MutableRaw<unsigned_int>(this,message,field);
    goto LAB_00212fa0;
  case 4:
    aVar18 = field->field_20;
    paVar9 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)
             MutableRaw<unsigned_long>(this,message,field);
LAB_00212fb6:
    *paVar9 = aVar18;
    break;
  case 5:
    aVar18 = field->field_20;
    paVar9 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)
             MutableRaw<double>(this,message,field);
    *paVar9 = aVar18;
    break;
  case 6:
    fVar1 = (float)(field->field_20).default_value_int32_t_;
    pfVar13 = MutableRaw<float>(this,message,field);
    *pfVar13 = fVar1;
    break;
  case 7:
    bVar4 = (field->field_20).default_value_bool_;
    pbVar14 = MutableRaw<bool>(this,message,field);
    *pbVar14 = bVar4;
    break;
  case 8:
    pEVar11 = FieldDescriptor::default_value_enum(field);
    uVar17 = pEVar11->number_;
LAB_00212f92:
    puVar12 = (uint *)MutableRaw<int>(this,message,field);
LAB_00212fa0:
    *puVar12 = uVar17;
    break;
  case 9:
    CVar6 = FieldDescriptor::cpp_string_type(field);
    if ((CVar6 == kView) || (CVar6 == kString)) {
      bVar4 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
      if (bVar4) {
        pIVar16 = MutableRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
        (pIVar16->field_0).str_._M_string_length = 0;
        **(undefined1 **)&pIVar16->field_0 = 0;
      }
      else {
        this_09 = MutableRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        internal::ArenaStringPtr::Destroy(this_09);
        (this_09->tagged_ptr_).ptr_ = &internal::fixed_address_empty_string;
      }
    }
    else if (CVar6 == kCord) {
      if ((field->field_0x1 & 1) != 0) {
        pcVar2 = (((field->field_20).default_value_string_)->_M_dataplus)._M_p;
        sVar3 = ((field->field_20).default_value_string_)->_M_string_length;
        pCVar15 = MutableRaw<absl::lts_20250127::Cord>(this,message,field);
        src._M_str = pcVar2;
        src._M_len = sVar3;
        absl::lts_20250127::Cord::operator=(pCVar15,src);
        return;
      }
      pCVar15 = MutableRaw<absl::lts_20250127::Cord>(this,message,field);
      absl::lts_20250127::Cord::Clear(pCVar15);
      return;
    }
    break;
  case 10:
    ppMVar10 = MutableRaw<google::protobuf::Message*>(this,message,field);
    (*((*ppMVar10)->super_MessageLite)._vptr_MessageLite[2])();
    return;
  }
  return;
switchD_00212cbd_caseD_9:
  CVar6 = FieldDescriptor::cpp_string_type(field);
  if ((CVar6 != kView) && (CVar6 != kString)) {
    if (CVar6 != kCord) {
      return;
    }
    this_08 = MutableRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                        (this,message,field);
    RepeatedField<absl::lts_20250127::Cord>::Clear(this_08);
    return;
  }
  pRVar8 = &MutableRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this,message,field)
            ->super_RepeatedPtrFieldBase;
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(pRVar8);
  return;
}

Assistant:

void Reflection::ClearField(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(ClearField, message);
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (schema_.InRealOneof(field)) {
      ClearOneofField(message, field);
      return;
    }
    if (HasFieldSingular(*message, field)) {
      ClearHasBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
    *MutableRaw<TYPE>(message, field) = field->default_value_##TYPE(); \
    break;

        CLEAR_TYPE(INT32, int32_t);
        CLEAR_TYPE(INT64, int64_t);
        CLEAR_TYPE(UINT32, uint32_t);
        CLEAR_TYPE(UINT64, uint64_t);
        CLEAR_TYPE(FLOAT, float);
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL, bool);
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
              field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              if (field->has_default_value()) {
                *MutableRaw<absl::Cord>(message, field) =
                    field->default_value_string();
              } else {
                MutableRaw<absl::Cord>(message, field)->Clear();
              }
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              if (IsInlined(field)) {
                // Currently, string with default value can't be inlined. So we
                // don't have to handle default value here.
                MutableRaw<InlinedStringField>(message, field)->ClearToEmpty();
              } else if (IsMicroString(field)) {
                if (field->has_default_value()) {
                  // TODO: Use an unowned block instead.
                  MutableRaw<MicroString>(message, field)
                      ->Set(field->default_value_string(), message->GetArena());
                } else {
                  MutableRaw<MicroString>(message, field)->Clear();
                }
              } else {
                auto* str = MutableRaw<ArenaStringPtr>(message, field);
                str->Destroy();
                str->InitDefault();
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          (*MutableRaw<Message*>(message, field))->Clear();
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            MutableRaw<RepeatedField<absl::Cord>>(message, field)->Clear();
            break;
          case FieldDescriptor::CppStringType::kView:
          case FieldDescriptor::CppStringType::kString:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)->Clear();
        } else {
          // We don't know which subclass of RepeatedPtrFieldBase the type is,
          // so we use RepeatedPtrFieldBase directly.
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->Clear<GenericTypeHandler<Message> >();
        }
        break;
      }
    }
  }
}